

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lighting.cpp
# Opt level: O1

shared_ptr<Lighting> __thiscall
Lighting::Create(Lighting *this,shared_ptr<EnvironmentMap> *environment_map)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Lighting> sVar2;
  
  this->m_light_type = kConstantColor;
  (this->m_sun_radiance).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  puVar1 = (undefined8 *)operator_new(0x30);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_0032cd78;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  *(undefined8 **)&(this->m_sun_radiance).field_1 = puVar1;
  *(undefined8 **)this = puVar1 + 2;
  puVar1[4] = (environment_map->super___shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 5),
             &(environment_map->super___shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  *(undefined8 *)((long)puVar1 + 0x14) = 0x40a0000040a00000;
  *(undefined4 *)((long)puVar1 + 0x1c) = 0x40a00000;
  sVar2.super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Lighting>)sVar2.super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Lighting> Lighting::Create(const std::shared_ptr<EnvironmentMap> &environment_map) {
	std::shared_ptr<Lighting> ret = std::make_shared<Lighting>();
	ret->m_environment_map_ptr = environment_map;
	ret->m_sun_radiance = glm::vec3(kDefaultConstantColor);

	return ret;
}